

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

bool __thiscall tinyxml2::XMLDeclaration::ShallowEqual(XMLDeclaration *this,XMLNode *compare)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  char *pcVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  long *plVar2;
  
  iVar1 = (*compare->_vptr_XMLNode[10])(compare);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    lVar3 = (**(code **)(*plVar2 + 0x48))(plVar2);
    if (lVar3 == 0) {
      pcVar4 = StrPair::GetStr((StrPair *)(plVar2 + 3));
    }
    else {
      pcVar4 = (char *)0x0;
    }
    iVar1 = (*(this->super_XMLNode)._vptr_XMLNode[9])();
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      pcVar5 = StrPair::GetStr(&(this->super_XMLNode)._value);
    }
    else {
      pcVar5 = (char *)0x0;
    }
    if (pcVar4 == pcVar5) {
      return true;
    }
    bVar7 = *pcVar4 == '\0';
    if ((bVar7) || (*pcVar4 != *pcVar5)) {
      bVar8 = false;
    }
    else {
      lVar3 = 1;
      do {
        lVar6 = lVar3;
        bVar7 = pcVar4[lVar6] == '\0';
        if ((bVar7) || (pcVar4[lVar6] != pcVar5[lVar6])) break;
        lVar3 = lVar6 + 1;
      } while ((int)lVar6 != 0x7fffffff);
      bVar8 = (int)lVar6 == 0x7fffffff;
      pcVar5 = pcVar5 + lVar6;
    }
    if (bVar8) {
      return true;
    }
    if ((bVar7) && (*pcVar5 == '\0')) {
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLDeclaration::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLDeclaration* declaration = compare->ToDeclaration();
    return ( declaration && XMLUtil::StringEqual( declaration->Value(), Value() ));
}